

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O3

void build_eq(Grammar *g)

{
  long *plVar1;
  long *plVar2;
  void *pvVar3;
  uint uVar4;
  State *pSVar5;
  State *pSVar6;
  State *pSVar7;
  State *pSVar8;
  State *pSVar9;
  Action **ppAVar10;
  Action **ppAVar11;
  Rule *pRVar12;
  Rule *pRVar13;
  uint *puVar14;
  uint *puVar15;
  State **ppSVar16;
  long lVar17;
  bool bVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  void *__ptr;
  Goto **ppGVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  
  uVar25 = (ulong)(g->states).n;
  __ptr = calloc(1,uVar25 * 0x18);
  do {
    if ((int)uVar25 == 0) break;
    uVar23 = 1;
    bVar18 = false;
    uVar26 = 0;
    do {
      uVar24 = uVar26 + 1;
      if (uVar24 < uVar25) {
        pSVar5 = (g->states).v[uVar26];
        plVar1 = (long *)((long)__ptr + (ulong)pSVar5->index * 0x18);
        uVar26 = uVar23;
        do {
          if (*plVar1 == 0) {
            pSVar6 = (g->states).v[uVar26];
            plVar2 = (long *)((long)__ptr + (ulong)pSVar6->index * 0x18);
            if ((*plVar2 == 0) &&
               (((pSVar5->same_shifts == pSVar6->same_shifts || (pSVar6->same_shifts == pSVar5)) &&
                (uVar19 = (pSVar5->gotos).n, uVar19 == (pSVar6->gotos).n)))) {
              if (uVar19 != 0) {
                ppGVar22 = (pSVar5->gotos).v;
                uVar25 = 0;
                do {
                  uVar19 = elem_symbol(g,ppGVar22[uVar25]->elem);
                  uVar20 = elem_symbol(g,(pSVar6->gotos).v[uVar25]->elem);
                  if (uVar19 != uVar20) goto LAB_0013cd18;
                  ppGVar22 = (pSVar5->gotos).v;
                  pSVar7 = ppGVar22[uVar25]->state;
                  pSVar8 = (pSVar6->gotos).v[uVar25]->state;
                  if (pSVar7 != pSVar8) {
                    pSVar9 = *(State **)((long)__ptr + (ulong)pSVar7->index * 0x18);
                    if ((((pSVar9 != pSVar8) &&
                         (*(State **)((long)__ptr + (ulong)pSVar8->index * 0x18) != pSVar7)) ||
                        ((plVar2[2] != 0 &&
                         (plVar2[2] != *(long *)((long)__ptr + (ulong)pSVar8->index * 0x18))))) ||
                       (((State *)plVar1[2] != (State *)0x0 && ((State *)plVar1[2] != pSVar9))))
                    goto LAB_0013cd18;
                    plVar2[2] = (long)pSVar8;
                    plVar1[2] = (long)pSVar7;
                  }
                  uVar25 = uVar25 + 1;
                } while (uVar25 < (pSVar5->gotos).n);
              }
              uVar4 = (pSVar5->reduce_actions).n;
              if (uVar4 == (pSVar6->reduce_actions).n) {
                if ((ulong)uVar4 != 0) {
                  ppAVar10 = (pSVar5->reduce_actions).v;
                  ppAVar11 = (pSVar6->reduce_actions).v;
                  uVar25 = 0;
                  do {
                    pRVar12 = ppAVar10[uVar25]->rule;
                    pRVar13 = ppAVar11[uVar25]->rule;
                    if (pRVar12 != pRVar13) {
                      if (pRVar12->prod != pRVar13->prod) goto LAB_0013cd18;
                      if ((pRVar12->elems).n != (pRVar13->elems).n) {
                        if ((((Rule *)plVar2[1] != (Rule *)0x0) && ((Rule *)plVar2[1] != pRVar13))
                           || (((Rule *)plVar1[1] != (Rule *)0x0 && ((Rule *)plVar1[1] != pRVar12)))
                           ) goto LAB_0013cd18;
                        plVar2[1] = (long)pRVar13;
                        plVar1[1] = (long)pRVar12;
                      }
                    }
                    uVar25 = uVar25 + 1;
                  } while (uVar4 != uVar25);
                }
                *plVar2 = (long)pSVar5;
                bVar18 = true;
              }
            }
          }
LAB_0013cd18:
          uVar26 = uVar26 + 1;
          uVar4 = (g->states).n;
          uVar25 = (ulong)uVar4;
        } while (uVar26 < uVar4);
      }
      uVar23 = uVar23 + 1;
      uVar26 = uVar24;
    } while (uVar24 < uVar25);
  } while (bVar18);
  if ((int)uVar25 != 0) {
    uVar26 = 0;
    iVar21 = d_verbose_level;
    do {
      uVar23 = (ulong)(g->states).v[uVar26]->index;
      puVar14 = *(uint **)((long)__ptr + uVar23 * 0x18);
      if ((puVar14 != (uint *)0x0) && (2 < iVar21)) {
        printf("eq %d %d ",uVar23,(ulong)*puVar14);
        puVar15 = *(uint **)((long)__ptr + uVar23 * 0x18 + 0x10);
        if (puVar15 != (uint *)0x0) {
          printf("diff state (%d %d) ",(ulong)*puVar15,
                 (ulong)**(uint **)((long)__ptr + (ulong)*puVar14 * 0x18 + 0x10));
        }
        pRVar12 = *(Rule **)((long)__ptr + uVar23 * 0x18 + 8);
        if (pRVar12 != (Rule *)0x0) {
          printf("diff rule ");
          printf("[ ");
          print_rule(pRVar12);
          printf("][ ");
          print_rule(*(Rule **)((long)__ptr + (ulong)*puVar14 * 0x18 + 8));
          putchar(0x5d);
        }
        putchar(10);
        uVar25 = (ulong)(g->states).n;
        iVar21 = d_verbose_level;
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 < uVar25);
    if ((int)uVar25 != 0) {
      ppSVar16 = (g->states).v;
      uVar26 = 0;
      do {
        pSVar5 = ppSVar16[uVar26];
        pSVar6 = *(State **)((long)__ptr + (ulong)pSVar5->index * 0x18);
        if (pSVar6 != (State *)0x0) {
          pvVar3 = (void *)((long)__ptr + (ulong)pSVar5->index * 0x18);
          if (*(uint **)((long)pvVar3 + 0x10) != (uint *)0x0) {
            lVar17 = *(long *)((long)__ptr + (ulong)**(uint **)((long)pvVar3 + 0x10) * 0x18 + 8);
            if ((lVar17 == 0) || (*(int *)(lVar17 + 0x20) != 2)) {
              uVar4 = pSVar6->index;
              lVar17 = *(long *)((long)__ptr +
                                (ulong)**(uint **)((long)__ptr + (ulong)uVar4 * 0x18 + 0x10) * 0x18
                                + 8);
              if ((lVar17 == 0) || (*(int *)(lVar17 + 0x20) != 2)) goto LAB_0013cef7;
              pSVar6->reduces_to = pSVar5;
              pSVar5->reduces_with = *(Rule **)((long)pvVar3 + 8);
              pvVar3 = (void *)((long)__ptr + (ulong)uVar4 * 0x18);
            }
            else {
              pSVar5->reduces_to = pSVar6;
              pSVar5->reduces_with = *(Rule **)((long)__ptr + (ulong)pSVar6->index * 0x18 + 8);
            }
            pSVar5->reduces_to_then_with = *(Rule **)((long)pvVar3 + 8);
          }
        }
LAB_0013cef7:
        uVar26 = uVar26 + 1;
      } while (uVar25 != uVar26);
      if ((int)uVar25 != 0) {
        uVar26 = 0;
        iVar21 = d_verbose_level;
        do {
          pSVar5 = (g->states).v[uVar26];
          pSVar6 = pSVar5->reduces_to;
          if ((pSVar6 != (State *)0x0) && (iVar21 != 0)) {
            printf("reduces_to %d %d\n",(ulong)pSVar5->index,(ulong)pSVar6->index);
            uVar25 = (ulong)(g->states).n;
            iVar21 = d_verbose_level;
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 < uVar25);
      }
    }
  }
  free(__ptr);
  return;
}

Assistant:

void build_eq(Grammar *g) {
  uint i, j, k, changed = 1, x, xx;
  State *s, *ss;
  EqState *eq, *e, *ee;

  eq = (EqState *)MALLOC(sizeof(EqState) * g->states.n);
  memset(eq, 0, sizeof(EqState) * g->states.n);
  while (changed) {
    changed = 0;
    for (i = 0; i < g->states.n; i++) {
      s = g->states.v[i];
      e = &eq[s->index];
      for (j = i + 1; j < g->states.n; j++) {
        ss = g->states.v[j];
        ee = &eq[ss->index];
        if (e->eq || ee->eq) continue;
        if (s->same_shifts != ss->same_shifts && ss->same_shifts != s) continue;
        /* check gotos */
        if (s->gotos.n != ss->gotos.n) continue;
        for (k = 0; k < s->gotos.n; k++) {
          if (elem_symbol(g, s->gotos.v[k]->elem) != elem_symbol(g, ss->gotos.v[k]->elem)) goto Lcontinue;
          if (s->gotos.v[k]->state != ss->gotos.v[k]->state) {
            EqState *ge = &eq[s->gotos.v[k]->state->index];
            EqState *gee = &eq[ss->gotos.v[k]->state->index];
            if (ge->eq != ss->gotos.v[k]->state && gee->eq != s->gotos.v[k]->state) goto Lcontinue;
            if ((ee->diff_state && ee->diff_state != eq[ss->gotos.v[k]->state->index].eq) ||
                (e->diff_state && e->diff_state != eq[s->gotos.v[k]->state->index].eq))
              goto Lcontinue;
            /* allow one different state */
            ee->diff_state = ss->gotos.v[k]->state;
            e->diff_state = s->gotos.v[k]->state;
          }
        }
        /* check reductions */
        if (s->reduce_actions.n != ss->reduce_actions.n) continue;
        for (k = 0; k < s->reduce_actions.n; k++) {
          if (s->reduce_actions.v[k]->rule == ss->reduce_actions.v[k]->rule) continue;
          if (s->reduce_actions.v[k]->rule->prod != ss->reduce_actions.v[k]->rule->prod) goto Lcontinue;
          if ((x = s->reduce_actions.v[k]->rule->elems.n) != (xx = ss->reduce_actions.v[k]->rule->elems.n)) {
            if ((ee->diff_rule && ee->diff_rule != ss->reduce_actions.v[k]->rule) ||
                (e->diff_rule && e->diff_rule != s->reduce_actions.v[k]->rule))
              goto Lcontinue;
            /* allow one different rule */
            ee->diff_rule = ss->reduce_actions.v[k]->rule;
            e->diff_rule = s->reduce_actions.v[k]->rule;
          }
        }
        ee->eq = s;
        changed = 1;
      Lcontinue:;
      }
    }
  }
  for (i = 0; i < g->states.n; i++) {
    s = g->states.v[i];
    e = &eq[s->index];
    if (e->eq) {
      if (d_verbose_level > 2) {
        printf("eq %d %d ", s->index, e->eq->index);
        if (e->diff_state) printf("diff state (%d %d) ", e->diff_state->index, eq[e->eq->index].diff_state->index);
        if (e->diff_rule) {
          printf("diff rule ");
          printf("[ ");
          print_rule(e->diff_rule);
          printf("][ ");
          print_rule(eq[e->eq->index].diff_rule);
          printf("]");
        }
        printf("\n");
      }
    }
  }
  for (i = 0; i < g->states.n; i++) {
    s = g->states.v[i];
    e = &eq[s->index];
    if (e->eq && e->diff_state) {
      if (eq[e->diff_state->index].diff_rule && eq[e->diff_state->index].diff_rule->elems.n == 2) {
        s->reduces_to = e->eq;
        s->reduces_with = eq[e->eq->index].diff_rule;
        s->reduces_to_then_with = e->diff_rule;
      } else if (eq[eq[e->eq->index].diff_state->index].diff_rule &&
                 eq[eq[e->eq->index].diff_state->index].diff_rule->elems.n == 2) {
        e->eq->reduces_to = s;
        s->reduces_with = e->diff_rule;
        s->reduces_to_then_with = eq[e->eq->index].diff_rule;
      }
    }
  }
  for (i = 0; i < g->states.n; i++) {
    s = g->states.v[i];
    if (s->reduces_to)
      if (d_verbose_level) printf("reduces_to %d %d\n", s->index, s->reduces_to->index);
  }
  FREE(eq);
}